

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::readImageAspect
          (CopiesAndBlittingTestInstance *this,VkImage image,PixelBufferAccess *dst,
          ImageParms *imageParms)

{
  Move<vk::VkCommandBuffer_s_*> *cmdBuffer;
  int iVar1;
  int iVar2;
  int iVar3;
  ChannelOrder order;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  VkImageType VVar9;
  VkResult VVar10;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *pAVar11;
  TextureFormat TVar12;
  ulong __n;
  deUint32 queueFamilyIndex;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  VkBufferMemoryBarrier bufferBarrier;
  VkImageMemoryBarrier postImageBarrier;
  undefined8 local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  undefined8 local_ec;
  deUint32 local_e4;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_d4;
  VkImageType local_cc;
  VkImageMemoryBarrier imageBarrier;
  ConstPixelBufferAccess local_80;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  pAVar11 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar3 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
  iVar8 = tcu::getPixelSize((dst->super_ConstPixelBufferAccess).m_format);
  imageBarrier.oldLayout = iVar3 * iVar8 * iVar2 * iVar1;
  __n = (ulong)imageBarrier.oldLayout;
  VVar9 = imageParms->imageType;
  if (VVar9 != VK_IMAGE_TYPE_2D) {
    VVar9 = (imageParms->extent).depth;
  }
  uVar4._0_4_ = (imageParms->extent).width;
  uVar4._4_4_ = (imageParms->extent).height;
  imageBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier._16_8_ = (ulong)imageBarrier.dstAccessMask << 0x20;
  imageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarrier.srcQueueFamilyIndex = 2;
  imageBarrier.dstQueueFamilyIndex = 0;
  imageBarrier.image.m_internal._0_4_ = 1;
  imageBarrier.subresourceRange._0_8_ = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferBarrier,vk,device,
                     (VkBufferCreateInfo *)&imageBarrier,(VkAllocationCallbacks *)0x0);
  postImageBarrier.srcAccessMask = bufferBarrier.srcAccessMask;
  postImageBarrier.dstAccessMask = bufferBarrier.dstAccessMask;
  postImageBarrier.oldLayout = bufferBarrier.srcQueueFamilyIndex;
  postImageBarrier.newLayout = bufferBarrier.dstQueueFamilyIndex;
  postImageBarrier.sType = bufferBarrier.sType;
  postImageBarrier._4_4_ = bufferBarrier._4_4_;
  postImageBarrier.pNext = bufferBarrier.pNext;
  bufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarrier._4_4_ = 0;
  bufferBarrier.pNext = (void *)0x0;
  bufferBarrier.srcAccessMask = 0;
  bufferBarrier.dstAccessMask = 0;
  bufferBarrier.srcQueueFamilyIndex = 0;
  bufferBarrier.dstQueueFamilyIndex = 0;
  if (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)postImageBarrier._16_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)postImageBarrier._24_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       postImageBarrier._0_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)postImageBarrier.pNext;
  if (bufferBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&bufferBarrier.pNext,
               (VkBuffer)bufferBarrier._0_8_);
  }
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&postImageBarrier,vk,device,
             (VkBuffer)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*pAVar11->_vptr_Allocator[3])(&bufferBarrier,pAVar11,&postImageBarrier,1);
  uVar5 = bufferBarrier._0_8_;
  VVar10 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,
                      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                      *(undefined8 *)(bufferBarrier._0_8_ + 8),
                      *(undefined8 *)(bufferBarrier._0_8_ + 0x10));
  ::vk::checkResult(VVar10,
                    "vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x22f);
  memset(*(void **)(uVar5 + 0x18),0,__n);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar5 + 8),*(VkDeviceSize *)(uVar5 + 0x10),__n)
  ;
  TVar12 = ::vk::mapVkFormat(imageParms->format);
  bVar6 = tcu::hasDepthComponent(TVar12.order);
  bVar7 = tcu::hasStencilComponent(TVar12.order);
  iVar1 = (uint)bVar6 * 2 + (uint)bVar7 * 4;
  postImageBarrier.subresourceRange.aspectMask = iVar1 + (uint)(iVar1 == 0);
  imageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier.srcAccessMask = 0x1000;
  imageBarrier.dstAccessMask = 0x800;
  imageBarrier.oldLayout = imageParms->operationLayout;
  imageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  imageBarrier.srcQueueFamilyIndex = 0xffffffff;
  imageBarrier.dstQueueFamilyIndex = 0xffffffff;
  imageBarrier.subresourceRange.baseMipLevel = 0;
  imageBarrier.subresourceRange.levelCount = 1;
  imageBarrier.subresourceRange.baseArrayLayer = 0;
  postImageBarrier.subresourceRange.layerCount = 1;
  if (imageParms->imageType == VK_IMAGE_TYPE_2D) {
    postImageBarrier.subresourceRange.layerCount = (imageParms->extent).depth;
  }
  bufferBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  bufferBarrier.pNext = (void *)0x0;
  bufferBarrier.srcAccessMask = 0x1000;
  bufferBarrier.dstAccessMask = 0x2000;
  bufferBarrier.srcQueueFamilyIndex = 0xffffffff;
  bufferBarrier.dstQueueFamilyIndex = 0xffffffff;
  bufferBarrier.buffer.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  bufferBarrier.offset = 0;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0x800;
  postImageBarrier.dstAccessMask = 0x1000;
  postImageBarrier.newLayout = imageBarrier.oldLayout;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  postImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  postImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier.subresourceRange.levelCount = 1;
  postImageBarrier.subresourceRange.baseArrayLayer = 0;
  order = (dst->super_ConstPixelBufferAccess).m_format.order;
  bufferBarrier.size = __n;
  postImageBarrier.image.m_internal = image.m_internal;
  imageBarrier.image.m_internal = image.m_internal;
  imageBarrier.subresourceRange.aspectMask = postImageBarrier.subresourceRange.aspectMask;
  imageBarrier.subresourceRange.layerCount = postImageBarrier.subresourceRange.layerCount;
  bVar6 = tcu::hasDepthComponent(order);
  bVar7 = tcu::hasStencilComponent(order);
  local_f0 = (uint)bVar6 * 2 + (uint)bVar7 * 4;
  local_f0 = local_f0 + (uint)(local_f0 == 0);
  local_100 = 0;
  local_f8 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  local_f4 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  local_ec = 0;
  local_e4 = 1;
  if (imageParms->imageType == VK_IMAGE_TYPE_2D) {
    local_e4 = (imageParms->extent).depth;
  }
  local_e0 = 0;
  local_d8 = 0;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext._0_4_ = 0;
  cmdBufferBeginInfo.pNext._4_4_ = 0;
  local_d4 = uVar4;
  local_cc = VVar9;
  VVar10 = (*vk->_vptr_DeviceInterface[0x49])
                     (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar10,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x285);
  cmdBuffer = &this->m_cmdBuffer;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,0x1000,0,0,
             0,0,0,1,&imageBarrier);
  (*vk->_vptr_DeviceInterface[99])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,image.m_internal,6
             ,buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,1,
             &local_100);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,0x5000,0,0,
             0,1,&bufferBarrier,1,&postImageBarrier);
  VVar10 = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(VVar10,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x289);
  submitCommandsAndWait(this,vk,device,queue,(VkCommandBuffer *)cmdBuffer);
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar5 + 8),*(VkDeviceSize *)(uVar5 + 0x10),__n)
  ;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_80,(TextureFormat *)dst,&(dst->super_ConstPixelBufferAccess).m_size,
             *(void **)(uVar5 + 0x18));
  tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)&local_80);
  if (uVar5 != 0) {
    (**(code **)(*(long *)uVar5 + 8))(uVar5);
  }
  if (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void CopiesAndBlittingTestInstance::readImageAspect (vk::VkImage					image,
													 const tcu::PixelBufferAccess&	dst,
													 const ImageParms&				imageParms)
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();
	const VkQueue				queue				= m_context.getUniversalQueue();
	Allocator&					allocator			= m_context.getDefaultAllocator();

	Move<VkBuffer>				buffer;
	de::MovePtr<Allocation>		bufferAlloc;
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const VkDeviceSize			pixelDataSize		= calculateSize(dst);
	const VkExtent3D			imageExtent			= getExtent3D(imageParms);

	// Create destination buffer
	{
		const VkBufferCreateInfo			bufferParams			=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			pixelDataSize,								// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, device, &bufferParams);
		bufferAlloc	= allocator.allocate(getBufferMemoryRequirements(vk, device, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));

		deMemset(bufferAlloc->getHostPtr(), 0, static_cast<size_t>(pixelDataSize));
		flushMappedMemoryRange(vk, device, bufferAlloc->getMemory(), bufferAlloc->getOffset(), pixelDataSize);
	}

	// Barriers for copying image to buffer
	const VkImageAspectFlags				formatAspect			= getAspectFlags(mapVkFormat(imageParms.format));
	const VkImageMemoryBarrier				imageBarrier			=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
		imageParms.operationLayout,					// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
		image,										// VkImage					image;
		{											// VkImageSubresourceRange	subresourceRange;
			formatAspect,			// VkImageAspectFlags	aspectMask;
			0u,						// deUint32				baseMipLevel;
			1u,						// deUint32				mipLevels;
			0u,						// deUint32				baseArraySlice;
			getArraySize(imageParms)// deUint32				arraySize;
		}
	};

	const VkBufferMemoryBarrier				bufferBarrier			=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		pixelDataSize								// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier				postImageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			oldLayout;
		imageParms.operationLayout,					// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
		image,										// VkImage					image;
		{
			formatAspect,								// VkImageAspectFlags	aspectMask;
			0u,											// deUint32				baseMipLevel;
			1u,											// deUint32				mipLevels;
			0u,											// deUint32				baseArraySlice;
			getArraySize(imageParms)					// deUint32				arraySize;
		}											// VkImageSubresourceRange	subresourceRange;
	};

	// Copy image to buffer
	const VkImageAspectFlags	aspect			= getAspectFlags(dst.getFormat());
	const VkBufferImageCopy		copyRegion		=
	{
		0u,									// VkDeviceSize				bufferOffset;
		(deUint32)dst.getWidth(),			// deUint32					bufferRowLength;
		(deUint32)dst.getHeight(),			// deUint32					bufferImageHeight;
		{
			aspect,								// VkImageAspectFlags		aspect;
			0u,									// deUint32					mipLevel;
			0u,									// deUint32					baseArrayLayer;
			getArraySize(imageParms),			// deUint32					layerCount;
		},									// VkImageSubresourceLayers	imageSubresource;
		{ 0, 0, 0 },						// VkOffset3D				imageOffset;
		imageExtent							// VkExtent3D				imageExtent;
	};

	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imageBarrier);
	vk.cmdCopyImageToBuffer(*m_cmdBuffer, image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *buffer, 1u, &copyRegion);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT|VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);

	// Read buffer data
	invalidateMappedMemoryRange(vk, device, bufferAlloc->getMemory(), bufferAlloc->getOffset(), pixelDataSize);
	tcu::copy(dst, tcu::ConstPixelBufferAccess(dst.getFormat(), dst.getSize(), bufferAlloc->getHostPtr()));
}